

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O2

ostream * operator<<(ostream *os,vector3 *vv)

{
  ostream *poVar1;
  
  std::operator<<(os,"<");
  poVar1 = std::ostream::_M_insert<double>(vv->x);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(vv->y);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(vv->z);
  std::operator<<(poVar1,"> ");
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const vector3& vv)
{
  os << "<" << vv.x << "," << vv.y << "," << vv.z << "> ";
  return os;
}